

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O0

void Assimp::IFC::CleanupOuterContour
               (vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *contour_flat,
               TempMesh *curmesh)

{
  pointer *this;
  pointer *this_00;
  reference this_01;
  bool bVar1;
  size_type sVar2;
  iterator iVar3;
  iterator iVar4;
  size_t sVar5;
  reference pvVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  char *sx;
  reference local_238;
  IntPoint *point;
  const_iterator __end5;
  const_iterator __begin5;
  Polygon *__range5;
  reference local_210;
  ExPolygon *ex;
  iterator __end4;
  iterator __begin4;
  ExPolygons *__range4;
  IntPoint local_1e0;
  reference local_1d0;
  IfcVector3 *pip_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *__range2_1;
  size_t countdown;
  size_t index;
  IntPoint local_190;
  reference local_180;
  IfcVector2 *pip;
  const_iterator __end2;
  const_iterator __begin2;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *__range2;
  Polygon clip;
  ExPolygons clipped;
  Clipper clipper;
  Polygon subject;
  undefined1 local_48 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> iold;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> vold;
  TempMesh *curmesh_local;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *contour_flat_local;
  
  this = &iold.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::vector
            ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)this);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  sVar2 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                    (&curmesh->mVerts);
  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
            ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)this,sVar2);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&curmesh->mVertcnt);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,sVar2);
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
            ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
             &clipper.field_0xb8);
  ClipperLib::Clipper::Clipper
            ((Clipper *)
             &clipped.
              super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::vector
            ((vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_> *)
             &clip.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
            ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)&__range2);
  sVar2 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::size(contour_flat);
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::reserve
            ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)&__range2,sVar2)
  ;
  __end2 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::begin
                     (contour_flat);
  pip = (IfcVector2 *)
        std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::end(contour_flat);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                                     *)&pip), bVar1) {
    local_180 = __gnu_cxx::
                __normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                ::operator*(&__end2);
    dVar10 = local_180->x * 1518500249.0;
    uVar8 = (ulong)dVar10;
    dVar9 = local_180->y * 1518500249.0;
    uVar7 = (ulong)dVar9;
    ClipperLib::IntPoint::IntPoint
              (&local_190,uVar8 | (long)(dVar10 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f,
               uVar7 | (long)(dVar9 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f);
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
              ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)&__range2,
               &local_190);
    __gnu_cxx::
    __normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
    ::operator++(&__end2);
  }
  bVar1 = ClipperLib::Orientation((Polygon *)&__range2);
  if (!bVar1) {
    iVar3 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::begin
                      ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                       &__range2);
    iVar4 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::end
                      ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                       &__range2);
    std::
    reverse<__gnu_cxx::__normal_iterator<ClipperLib::IntPoint*,std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>
              ((__normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                )iVar3._M_current,
               (__normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                )iVar4._M_current);
  }
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::reserve
            ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
             &clipper.field_0xb8,4);
  countdown = 0;
  __range2_1 = (vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)0x0;
  __end2_1 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin
                       (&curmesh->mVerts);
  pip_1 = (IfcVector3 *)
          std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                    (&curmesh->mVerts);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                        *)&pip_1);
    if (!bVar1) {
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector
                ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)&__range2);
      std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::~vector
                ((vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_> *)
                 &clip.
                  super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      ClipperLib::Clipper::~Clipper
                ((Clipper *)
                 &clipped.
                  super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector
                ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                 &clipper.field_0xb8);
      std::swap<aiVector3t<double>,std::allocator<aiVector3t<double>>>
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                 &iold.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&curmesh->mVerts);
      std::swap<unsigned_int,std::allocator<unsigned_int>>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,&curmesh->mVertcnt)
      ;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::~vector
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                 &iold.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      return;
    }
    local_1d0 = __gnu_cxx::
                __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                ::operator*(&__end2_1);
    if (__range2_1 == (vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)0x0) {
      sVar5 = countdown + 1;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&curmesh->mVertcnt,countdown);
      __range2_1 = (vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                   (ulong)*pvVar6;
      countdown = sVar5;
      if (__range2_1 != (vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)0x0)
      goto LAB_00972f92;
    }
    else {
LAB_00972f92:
      dVar10 = local_1d0->x * 1518500249.0;
      uVar8 = (ulong)dVar10;
      dVar9 = local_1d0->y * 1518500249.0;
      uVar7 = (ulong)dVar9;
      ClipperLib::IntPoint::IntPoint
                (&local_1e0,uVar8 | (long)(dVar10 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f,
                 uVar7 | (long)(dVar9 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f);
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
                ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                 &clipper.field_0xb8,&local_1e0);
      __range2_1 = (vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                   ((long)&__range2_1[-1].
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      if (__range2_1 == (vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)0x0) {
        bVar1 = ClipperLib::Orientation((Polygon *)&clipper.field_0xb8);
        if (!bVar1) {
          iVar3 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::begin
                            ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                             &clipper.field_0xb8);
          iVar4 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::end
                            ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                             &clipper.field_0xb8);
          std::
          reverse<__gnu_cxx::__normal_iterator<ClipperLib::IntPoint*,std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>
                    ((__normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                      )iVar3._M_current,
                     (__normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                      )iVar4._M_current);
        }
        ClipperLib::ClipperBase::AddPolygon
                  ((ClipperBase *)
                   ((long)&((clipped.
                             super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage[-1].holes.
                             super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                           )._M_impl.super__Vector_impl_data +
                   (long)&clipped.
                          super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage),
                   (Polygon *)&clipper.field_0xb8,ptSubject);
        ClipperLib::ClipperBase::AddPolygon
                  ((ClipperBase *)
                   ((long)&((clipped.
                             super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage[-1].holes.
                             super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                           )._M_impl.super__Vector_impl_data +
                   (long)&clipped.
                          super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage),(Polygon *)&__range2,
                   ptClip);
        ClipperLib::Clipper::Execute
                  ((Clipper *)
                   &clipped.
                    super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,ctIntersection,
                   (ExPolygons *)
                   &clip.
                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,pftNonZero,pftNonZero);
        this_00 = &clip.
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        __end4 = std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::begin
                           ((vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_> *
                            )this_00);
        ex = (ExPolygon *)
             std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::end
                       ((vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_> *)
                        this_00);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<ClipperLib::ExPolygon_*,_std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>_>
                                           *)&ex), bVar1) {
          local_210 = __gnu_cxx::
                      __normal_iterator<ClipperLib::ExPolygon_*,_std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>_>
                      ::operator*(&__end4);
          sVar2 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::size
                            (&local_210->outer);
          __range5._4_4_ = (undefined4)sVar2;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,
                     (value_type_conflict *)((long)&__range5 + 4));
          this_01 = local_210;
          __end5 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::begin
                             (&local_210->outer);
          point = (IntPoint *)
                  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::end
                            (&this_01->outer);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<const_ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                                             *)&point), bVar1) {
            local_238 = __gnu_cxx::
                        __normal_iterator<const_ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                        ::operator*(&__end5);
            aiVector3t<double>::aiVector3t
                      ((aiVector3t<double> *)&sx,(double)local_238->X / 1518500249.0,
                       (double)local_238->Y / 1518500249.0,0.0);
            std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                      ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                       &iold.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage,(value_type *)&sx);
            __gnu_cxx::
            __normal_iterator<const_ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
            ::operator++(&__end5);
          }
          __gnu_cxx::
          __normal_iterator<ClipperLib::ExPolygon_*,_std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>_>
          ::operator++(&__end4);
        }
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::clear
                  ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                   &clipper.field_0xb8);
        std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::clear
                  ((vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_> *)
                   &clip.
                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        ClipperLib::Clipper::Clear
                  ((Clipper *)
                   &clipped.
                    super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
    __gnu_cxx::
    __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
    ::operator++(&__end2_1);
  } while( true );
}

Assistant:

void CleanupOuterContour(const std::vector<IfcVector2>& contour_flat, TempMesh& curmesh)
{
    std::vector<IfcVector3> vold;
    std::vector<unsigned int> iold;

    vold.reserve(curmesh.mVerts.size());
    iold.reserve(curmesh.mVertcnt.size());

    // Fix the outer contour using polyclipper
    try {

        ClipperLib::Polygon subject;
        ClipperLib::Clipper clipper;
        ClipperLib::ExPolygons clipped;

        ClipperLib::Polygon clip;
        clip.reserve(contour_flat.size());
        for(const IfcVector2& pip : contour_flat) {
            clip.push_back(ClipperLib::IntPoint(  to_int64(pip.x), to_int64(pip.y) ));
        }

        if (!ClipperLib::Orientation(clip)) {
            std::reverse(clip.begin(), clip.end());
        }

        // We need to run polyclipper on every single polygon -- we can't run it one all
        // of them at once or it would merge them all together which would undo all
        // previous steps
        subject.reserve(4);
        size_t index = 0;
        size_t countdown = 0;
        for(const IfcVector3& pip : curmesh.mVerts) {
            if (!countdown) {
                countdown = curmesh.mVertcnt[index++];
                if (!countdown) {
                    continue;
                }
            }
            subject.push_back(ClipperLib::IntPoint(  to_int64(pip.x), to_int64(pip.y) ));
            if (--countdown == 0) {
                if (!ClipperLib::Orientation(subject)) {
                    std::reverse(subject.begin(), subject.end());
                }

                clipper.AddPolygon(subject,ClipperLib::ptSubject);
                clipper.AddPolygon(clip,ClipperLib::ptClip);

                clipper.Execute(ClipperLib::ctIntersection,clipped,ClipperLib::pftNonZero,ClipperLib::pftNonZero);

                for(const ClipperLib::ExPolygon& ex : clipped) {
                    iold.push_back(static_cast<unsigned int>(ex.outer.size()));
                    for(const ClipperLib::IntPoint& point : ex.outer) {
                        vold.push_back(IfcVector3(
                            from_int64(point.X),
                            from_int64(point.Y),
                            0.0f));
                    }
                }

                subject.clear();
                clipped.clear();
                clipper.Clear();
            }
        }
    }
    catch (const char* sx) {
        IFCImporter::LogError("Ifc: error during polygon clipping, wall contour line may be wrong: (Clipper: "
            + std::string(sx) + ")");

        return;
    }

    // swap data arrays
    std::swap(vold,curmesh.mVerts);
    std::swap(iold,curmesh.mVertcnt);
}